

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows2_Test::
~SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows2_Test
          (SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows2_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows2_Test
            ((SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows2_Test *)0x1e9298);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableAssignmentTypeMismatchThrows2)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let x: function = \(x: f32): void = { };
    x = 12;
    ret 0;
  }
  )SRC";
  throwTest(source);
}